

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O1

char * conv_path_to_utf8_with_tmpl
                 (GString *path,char *from_enc,out_fmt fmt_type,StrTransformFunc func,GError **error
                 )

{
  char cVar1;
  GError *pGVar2;
  gchar *pgVar3;
  gsize gVar4;
  GQuark GVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  long *plVar9;
  long lVar10;
  int *piVar11;
  undefined8 uVar12;
  long *plVar13;
  gchar *pgVar14;
  size_t sVar15;
  char *pcVar16;
  ushort uVar17;
  ulong uVar18;
  byte bVar19;
  byte *__s;
  size_t local_98;
  gsize o_left;
  char *o_ptr;
  char **local_80;
  out_fmt local_74;
  char *i_ptr;
  GError **local_68;
  StrTransformFunc local_60;
  long local_58;
  char *local_50;
  size_t local_48;
  _fmt_data *local_40;
  size_t local_38;
  
  local_74 = fmt_type;
  if (path == (GString *)0x0) {
LAB_001064f5:
    conv_path_to_utf8_with_tmpl_cold_6();
  }
  else {
    local_68 = error;
    local_60 = func;
    local_50 = from_enc;
    if (from_enc == (char *)0x0) {
      local_98 = ucs2_bytelen(path->str,path->len);
      local_48 = 2;
      from_enc = "UTF-16LE";
    }
    else {
      if (*from_enc == '\0') {
        g_return_if_fail_warning("rifiuti2","conv_path_to_utf8_with_tmpl","! from_enc || *from_enc")
        ;
        return (char *)0x0;
      }
      local_98 = strnlen(path->str,0x104);
      local_48 = 1;
    }
    i_ptr = path->str;
    local_38 = local_98;
    plVar8 = (long *)g_string_sized_new(local_98 + 1);
    o_left = ~plVar8[1] + plVar8[2];
    o_ptr = (char *)(plVar8[1] + *plVar8);
    local_80 = (char **)g_iconv_open("UTF-8",from_enc);
    g_log("rifiuti2",0x80,"Initial : r=%02zu, w=%02zu/%02zu",local_98,o_left,plVar8[2] + -1);
    plVar9 = (long *)g_ptr_array_new_with_free_func(g_free);
    local_58 = -1;
    lVar10 = local_58;
    if (local_98 != 0) {
      local_40 = fmt + local_74;
      do {
        if ((*i_ptr == '\0') && ((lVar10 = local_58, local_50 != (char *)0x0 || (i_ptr[1] == '\0')))
           ) break;
        lVar10 = g_iconv(local_80,&i_ptr,&local_98,&o_ptr,&o_left);
        plVar8[1] = ~o_left + plVar8[2];
        pcVar16 = (char *)(~o_left + plVar8[2] + *plVar8);
        if (o_ptr != pcVar16) {
          conv_path_to_utf8_with_tmpl_cold_1();
LAB_001064f0:
          conv_path_to_utf8_with_tmpl_cold_4();
          goto LAB_001064f5;
        }
        *pcVar16 = '\0';
        if (lVar10 != -1) break;
        piVar11 = __errno_location();
        gVar4 = o_left;
        sVar15 = local_98;
        iVar6 = *piVar11;
        lVar10 = plVar8[2];
        uVar12 = g_strerror(iVar6);
        g_log("rifiuti2",0x80,"Progress: r=%02zu, w=%02zu/%02zu, status=%zd (%s), str=%s",sVar15,
              gVar4,lVar10 + -1,0xffffffffffffffff,uVar12,*plVar8);
        if (iVar6 == 7) {
          plVar8 = (long *)g_string_set_size(plVar8,plVar8[2] * 2);
          o_left = ~plVar8[1] + plVar8[2];
          o_ptr = (char *)(plVar8[1] + *plVar8);
        }
        else if ((iVar6 == 0x54) || (iVar6 == 0x16)) {
          plVar13 = (long *)g_malloc(8);
          *plVar13 = local_38 - local_98;
          g_ptr_array_add(plVar9,plVar13);
          if (local_98 == 0) {
            conv_path_to_utf8_with_tmpl_cold_3();
          }
          else if (i_ptr == (char *)0x0) {
            conv_path_to_utf8_with_tmpl_cold_2();
          }
          else {
            sVar15 = local_98;
            if (local_98 != 1) {
              sVar15 = local_48;
            }
            if (sVar15 == 1) {
              uVar17 = (ushort)(byte)*i_ptr;
            }
            else {
              uVar17 = *(ushort *)i_ptr;
            }
            g_string_append_printf(plVar8,local_40->fallback_tmpl[sVar15],uVar17);
            i_ptr = i_ptr + sVar15;
            local_98 = local_98 - sVar15;
          }
          o_left = ~plVar8[1] + plVar8[2];
          o_ptr = (char *)(plVar8[1] + *plVar8);
          g_log("rifiuti2",0x80,"Progress: r=%02zu, w=%02zu/%02zu, str=%s",local_98,o_left,
                plVar8[2] + -1,*plVar8);
          g_iconv(local_80,0,0,&o_ptr,&o_left);
          plVar8[1] = ~o_left + plVar8[2];
          pcVar16 = (char *)(~o_left + plVar8[2] + *plVar8);
          if (o_ptr != pcVar16) goto LAB_001064f0;
          *pcVar16 = '\0';
        }
        lVar10 = local_58;
      } while (local_98 != 0);
    }
    local_58 = lVar10;
    g_log("rifiuti2",0x80,"Finally : r=%02zu, w=%02zu/%02zu, status=%zd, str=%s",local_98,o_left,
          plVar8[2] + -1,local_58,*plVar8);
    g_iconv_close(local_80);
    if (local_68 != (GError **)0x0) {
      pGVar2 = *local_68;
      GVar5 = rifiuti_record_error_quark();
      iVar6 = g_error_matches(pGVar2,GVar5,3);
      if ((iVar6 != 0) && ((int)plVar9[1] != 0)) {
        pgVar3 = (*local_68)->message;
        uVar12 = g_string_new(pgVar3);
        uVar12 = g_string_append(uVar12,", at offset:");
        if ((int)plVar9[1] != 0) {
          uVar18 = 0;
          do {
            g_string_append_printf(uVar12," %zu",**(undefined8 **)(*plVar9 + uVar18 * 8));
            uVar18 = uVar18 + 1;
          } while (uVar18 < *(uint *)(plVar9 + 1));
        }
        pgVar14 = (gchar *)g_string_free(uVar12,0);
        (*local_68)->message = pgVar14;
        g_free(pgVar3);
      }
    }
    g_ptr_array_free(plVar9,1);
    iVar6 = g_utf8_validate(*plVar8,0xffffffffffffffff,0);
    if (iVar6 != 0) {
      __s = (byte *)*plVar8;
      if (local_60 == (StrTransformFunc)0x0) {
        sVar15 = strlen((char *)__s);
        uVar12 = g_string_sized_new(sVar15 * 2);
        lVar10 = _g_utf8_skip;
        bVar19 = *__s;
        if (bVar19 != 0) {
          local_80 = fmt[local_74].fallback_tmpl;
          do {
            iVar6 = g_utf8_get_char(__s);
            cVar1 = *(char *)(lVar10 + (ulong)bVar19);
            iVar7 = g_unichar_isgraph(iVar6);
            if ((iVar6 == 0x20) || (iVar7 != 0)) {
              uVar12 = g_string_append_len(uVar12,__s,(long)cVar1);
            }
            else {
              g_string_append_printf(uVar12,*local_80,iVar6);
            }
            __s = __s + cVar1;
            bVar19 = *__s;
          } while (bVar19 != 0);
        }
        pcVar16 = (char *)g_string_free(uVar12,0);
      }
      else {
        pcVar16 = (*local_60)((char *)__s);
      }
      g_string_free(plVar8,1);
      return pcVar16;
    }
    conv_path_to_utf8_with_tmpl_cold_5();
  }
  return (char *)0x0;
}

Assistant:

char *
conv_path_to_utf8_with_tmpl (const GString   *path,
                             const char      *from_enc,
                             out_fmt          fmt_type,
                             StrTransformFunc func,
                             GError         **error)
{
    char            *i_ptr,
                    *o_ptr,
                    *result;
    gsize            i_size,
                     i_left,
                     o_left,
                     char_sz,
                     status;
    GIConv           conv;
    GPtrArray       *err_offsets;
    GString         *s;

    // For unicode path, the first char must be ASCII drive letter
    // or slash. And since it is in little endian, first byte is
    // always non-null
    g_return_val_if_fail (path != NULL, NULL);
    g_return_val_if_fail (! from_enc || *from_enc, NULL);

    if (from_enc)
    {
        char_sz = sizeof (char);
        i_left = i_size = strnlen (path->str, WIN_PATH_MAX);
    }
    else
    {
        char_sz = sizeof (gunichar2);
        i_left = i_size = ucs2_bytelen (path->str, path->len);
    }
    i_ptr = path->str;

    // Ballpark figure, GString decides alloc size on its own
    s = g_string_sized_new (i_size + 1);
    _sync_pos (s, &o_left, &o_ptr, true);

    // Shouldn't fail, encoding already tested upon start of prog
    conv = g_iconv_open ("UTF-8", from_enc ? from_enc : "UTF-16LE");

    g_debug ("Initial : r=%02zu, w=%02zu/%02zu",
        i_left, o_left, s->allocated_len - 1);
    err_offsets = g_ptr_array_new_with_free_func ((GDestroyNotify) g_free);

    // Pass 1: Convert to UTF-8, all illegal seq become escaped hex

    while (i_left > 0)
    {
        if (*i_ptr == '\0') {
            if (from_enc   != NULL) break;
            if (*(i_ptr+1) == '\0') break; /* utf-16: check "\0\0" */
        }

        // When non-reversible char are converted to \uFFFD, there
        // is nothing we can do. Just accept the status quo.
        status = g_iconv (conv, &i_ptr, &i_left, &o_ptr, &o_left);
        _sync_pos (s, &o_left, &o_ptr, false);
        if (status != (gsize) -1)
            break;

        int e = errno;
        g_debug ("Progress: r=%02zu, w=%02zu/%02zu, status=%zd (%s), str=%s",
            i_left, o_left, s->allocated_len - 1,
            status, g_strerror(e), s->str);

        switch (e)
        {
        case EINVAL:
        case EILSEQ:
        {
            size_t *processed = g_malloc (sizeof (size_t));
            *processed = i_size - i_left;
            g_ptr_array_add (err_offsets, processed);
        }
            _advance_octet (char_sz, &i_ptr, &i_left, s, fmt_type);
            _sync_pos (s, &o_left, &o_ptr, true);
            g_debug ("Progress: r=%02zu, w=%02zu/%02zu, str=%s",
                i_left, o_left, s->allocated_len - 1, s->str);
            g_iconv (conv, NULL, NULL, &o_ptr, &o_left);  // reset state
            _sync_pos (s, &o_left, &o_ptr, false);
            break;
        case E2BIG:
            s = g_string_set_size (s, s->allocated_len * 2);
            _sync_pos (s, &o_left, &o_ptr, true);
            break;
        }
    }

    g_debug ("Finally : r=%02zu, w=%02zu/%02zu, status=%zd, str=%s",
        i_left, o_left, s->allocated_len - 1, status, s->str);

    g_iconv_close (conv);

    if (error &&
        g_error_matches ((const GError *) (*error),
            R2_REC_ERROR, R2_REC_ERROR_CONV_PATH) &&
        err_offsets->len > 0)
    {
        // More detailed error message showing offsets
        char *old = (*error)->message;
        GString *dbg_str = g_string_new ((const char *) old);
        dbg_str = g_string_append (dbg_str, ", at offset:");
        for (size_t i = 0; i < err_offsets->len; i++)
        {
            g_string_append_printf (dbg_str, " %zu",
                *((size_t *) (err_offsets->pdata[i])));
        }
        (*error)->message = g_string_free (dbg_str, FALSE);
        g_free (old);
    }

    g_ptr_array_free (err_offsets, TRUE);

    // Pass 2: Post processing, e.g. convert non-printable chars to hex

    g_return_val_if_fail (g_utf8_validate (s->str, -1, NULL), NULL);

    if (func == NULL)
        result = _filter_printable_char (s->str, fmt_type);
    else
        result = func (s->str);
    g_string_free (s, TRUE);

    return result;
}